

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::ClosePendingScriptContexts(ThreadContext *this)

{
  ScriptContext *pSVar1;
  ScriptContext *this_00;
  
  this_00 = this->rootPendingClose;
  if (this->rootPendingClose != (ScriptContext *)0x0) {
    do {
      pSVar1 = this_00->nextPendingClose;
      Js::ScriptContext::Close(this_00,false);
      this_00 = pSVar1;
    } while (pSVar1 != (ScriptContext *)0x0);
    this->rootPendingClose = (ScriptContext *)0x0;
  }
  return;
}

Assistant:

void ThreadContext::ClosePendingScriptContexts()
{
    Js::ScriptContext * scriptContext = rootPendingClose;
    if (scriptContext == nullptr)
    {
        return;
    }
    Js::ScriptContext * nextScriptContext;
    do
    {
        nextScriptContext = scriptContext->GetNextPendingClose();
        scriptContext->Close(false);
        scriptContext = nextScriptContext;
    }
    while (scriptContext);
    rootPendingClose = nullptr;
}